

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

bool __thiscall
QTest::TestMethods::invokeTest
          (TestMethods *this,int index,QLatin1StringView tag,optional<QTest::WatchDog> *watchDog)

{
  QArrayData *pQVar1;
  char16_t *pcVar2;
  long lVar3;
  QBenchmarkGlobalData *pQVar4;
  FILE *pFVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QTestTable *this_00;
  QTestData *pQVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar15;
  ulong extraout_RAX_01;
  undefined8 extraout_RAX_02;
  char16_t *pcVar16;
  char *pcVar17;
  ulong uVar18;
  char *pcVar19;
  int index_00;
  int i;
  int iVar20;
  ulong uVar21;
  long in_FS_OFFSET;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QAnyStringView QVar26;
  QTestTable table;
  char member [512];
  int local_324;
  QArrayData *in_stack_fffffffffffffd28;
  longlong local_2d0;
  QArrayData *local_2c0;
  char *local_2b8;
  QTestTable local_2a8;
  QArrayData *local_2a0;
  char *local_298;
  qsizetype local_290;
  undefined1 local_288 [40];
  QString local_260;
  QStringBuilder<QLatin1String,_QLatin1String> local_248 [16];
  QString *local_48;
  undefined8 uStack_40;
  long local_38;
  
  pcVar16 = (char16_t *)tag.m_data;
  uVar18 = tag.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_288._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_288._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_288._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_288._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBenchmarkTestMethodData::QBenchmarkTestMethodData((QBenchmarkTestMethodData *)local_288);
  QBenchmarkTestMethodData::current = (QBenchmarkTestMethodData *)local_288;
  if ((ulong)(long)index <
      (ulong)((long)(this->m_methods).super__Vector_base<QMetaMethod,_std::allocator<QMetaMethod>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_methods).super__Vector_base<QMetaMethod,_std::allocator<QMetaMethod>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4)) {
    QMetaMethod::name();
    local_248[0].a.m_size = local_290;
    local_248[0].a.m_data = local_298;
    local_248[0].b.m_size = 2;
    local_248[0].b.m_data = "()";
    QStringBuilder<QLatin1String,_QLatin1String>::convertTo<QString>(&local_260,local_248);
    pQVar4 = QBenchmarkGlobalData::current;
    pQVar1 = &((QBenchmarkGlobalData::current->context).slotName.d.d)->super_QArrayData;
    (QBenchmarkGlobalData::current->context).slotName.d.d = local_260.d.d;
    pcVar2 = (pQVar4->context).slotName.d.ptr;
    (pQVar4->context).slotName.d.ptr = local_260.d.ptr;
    uVar21 = (pQVar4->context).slotName.d.size;
    (pQVar4->context).slotName.d.size = local_260.d.size;
    local_260.d.d = (Data *)pQVar1;
    local_260.d.ptr = pcVar2;
    local_260.d.size = uVar21;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
    memset(local_248,0xaa,0x200);
    local_2a8.d = (QTestTablePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QTestTable::QTestTable(&local_2a8);
    pcVar19 = local_298;
    if (local_298 == (char *)0x0) {
      pcVar19 = (char *)&QByteArray::_empty;
    }
    QTestResult::setCurrentTestFunction(pcVar19);
    this_00 = QTestTable::globalTestTable();
    iVar8 = QTestTable::dataCount(this_00);
    iVar10 = 1;
    if (1 < iVar8) {
      iVar10 = iVar8;
    }
    pcVar19 = (char *)0x0;
    local_324 = 0;
    do {
      bVar6 = QTestTable::isEmpty(this_00);
      if (!bVar6) {
        pQVar11 = QTestTable::testData(this_00,local_324);
        QTestResult::setCurrentGlobalTestData(pQVar11);
      }
      if (local_324 == 0) {
        pcVar17 = local_298;
        if (local_298 == (char *)0x0) {
          pcVar17 = (char *)&QByteArray::_empty;
        }
        snprintf((char *)local_248,0x200,"%s_data()",pcVar17);
        if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
            super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
            super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
          WatchDog::setExpectation((WatchDog *)watchDog,TestFunctionEnd);
        }
        invokeTestMethodIfExists((char *)local_248,currentTestObject);
        if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
            super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
            super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
          WatchDog::setExpectation((WatchDog *)watchDog,TestFunctionStart);
        }
        bVar6 = QTestResult::skipCurrentTest();
        if (bVar6) break;
      }
      iVar9 = QTestTable::dataCount(&local_2a8);
      iVar20 = 1;
      if (1 < iVar9) {
        iVar20 = iVar9;
      }
      index_00 = 0;
      do {
        QTestResult::setSkipCurrentTest(false);
        QTestResult::setBlacklistCurrentTest(false);
        if (iVar9 == 0) {
          pcVar17 = (char *)0x0;
        }
        else {
          pQVar11 = QTestTable::testData(&local_2a8,index_00);
          pcVar17 = QTestData::dataTag(pQVar11);
        }
        if (pcVar17 == (char *)0x0) {
          uVar21 = 0;
        }
        else {
          uVar12 = 0xffffffffffffffff;
          do {
            uVar21 = uVar12 + 1;
            lVar3 = uVar12 + 1;
            uVar12 = uVar21;
          } while (pcVar17[lVar3] != '\0');
        }
        if (iVar8 == 0) {
          pcVar13 = (char *)0x0;
        }
        else {
          pQVar11 = QTestTable::testData(this_00,local_324);
          pcVar13 = QTestData::dataTag(pQVar11);
        }
        if (pcVar13 == (char *)0x0) {
          uVar12 = 0;
        }
        else {
          uVar14 = 0xffffffffffffffff;
          do {
            uVar12 = uVar14 + 1;
            lVar3 = uVar14 + 1;
            uVar14 = uVar12;
          } while (pcVar13[lVar3] != '\0');
        }
        if ((((uVar18 == 0) ||
             ((uVar21 == uVar18 &&
              (QVar22.m_data = pcVar17, QVar22.m_size = uVar21,
              cVar7 = QtPrivate::equalStrings(tag,QVar22), cVar7 != '\0')))) ||
            ((uVar12 == uVar18 &&
             (QVar23.m_data = pcVar13, QVar23.m_size = uVar12,
             cVar7 = QtPrivate::equalStrings(tag,QVar23), cVar7 != '\0')))) ||
           ((((QVar24.m_data = pcVar13, QVar24.m_size = uVar12,
              cVar7 = QtPrivate::startsWith(tag,QVar24,CaseSensitive), cVar7 != '\0' &&
              (QVar25.m_data = pcVar17, QVar25.m_size = uVar21,
              cVar7 = QtPrivate::endsWith(tag,QVar25,CaseSensitive), cVar7 != '\0')) &&
             (uVar21 + uVar12 + 1 == uVar18)) && (*(char *)((long)pcVar16 + uVar12) == ':')))) {
          if (iVar9 != 0) {
            pQVar11 = QTestTable::testData(&local_2a8,index_00);
            QTestData::dataTag(pQVar11);
          }
          if (iVar8 != 0) {
            pQVar11 = QTestTable::testData(this_00,local_324);
            QTestData::dataTag(pQVar11);
          }
          bVar6 = QTestPrivate::checkBlackLists
                            ((char *)in_stack_fffffffffffffd28,(char *)this,pcVar19);
          if (((bVar6) && (QTestResult::setBlacklistCurrentTest(true), bVar6)) &&
             (skipBlacklisted == '\x01')) {
            QTestResult::addSkip
                      ("Skipping blacklisted test since -skipblacklisted option is set.",(char *)0x0
                       ,0);
            QTestResult::setSkipCurrentTest(true);
            QTestResult::finishedCurrentTestData();
            QTestResult::finishedCurrentTestDataCleanup();
            uVar15 = extraout_RAX;
          }
          else {
            if (index_00 < iVar9) {
              pQVar11 = QTestTable::testData(&local_2a8,index_00);
            }
            else {
              pQVar11 = (QTestData *)0x0;
            }
            QTestResult::setCurrentTestData(pQVar11);
            lastMouseTimestamp = lastMouseTimestamp + 500;
            QTestPrivate::qtestMouseButtons = 0;
            if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
                super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
                super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
              WatchDog::setExpectation((WatchDog *)watchDog,TestFunctionEnd);
            }
            invokeTestOnData(this,index);
            if ((watchDog->super__Optional_base<QTest::WatchDog,_false,_false>)._M_payload.
                super__Optional_payload<QTest::WatchDog,_true,_false,_false>.
                super__Optional_payload_base<QTest::WatchDog>._M_engaged == true) {
              WatchDog::setExpectation((WatchDog *)watchDog,TestFunctionStart);
            }
            QTestResult::setCurrentTestData((QTestData *)0x0);
            uVar15 = extraout_RAX_00;
          }
          pcVar19 = (char *)CONCAT71((int7)((ulong)uVar15 >> 8),1);
          if (iVar8 == 0 && uVar18 != 0) break;
        }
        index_00 = index_00 + 1;
      } while (index_00 != iVar20);
      QTestResult::setCurrentGlobalTestData((QTestData *)0x0);
      local_324 = local_324 + 1;
    } while (local_324 != iVar10);
    if ((uVar18 != 0) && (((ulong)pcVar19 & 1) == 0)) {
      fprintf(_stderr,"Unknown testdata for function %s(): \'%s\'\n",local_298,pcVar16);
      iVar10 = QTestTable::dataCount(&local_2a8);
      invokeTest();
      if ((extraout_RAX_01 & 1) == 0) {
        iVar8 = 0;
        do {
          pFVar5 = _stderr;
          pQVar11 = QTestTable::testData(&local_2a8,iVar8);
          pcVar19 = QTestData::dataTag(pQVar11);
          fprintf(pFVar5,"\t%s\n",pcVar19);
          iVar8 = iVar8 + 1;
        } while (iVar10 != iVar8);
      }
      iVar8 = QTestTable::dataCount(this_00);
      if ((iVar8 != 0) && (fputs("Available global data tags:\n",_stderr), 0 < iVar8)) {
        iVar20 = 0;
        do {
          pFVar5 = _stderr;
          pQVar11 = QTestTable::testData(this_00,iVar20);
          pcVar19 = QTestData::dataTag(pQVar11);
          fprintf(pFVar5,"\t%s\n",pcVar19);
          iVar20 = iVar20 + 1;
        } while (iVar8 != iVar20);
      }
      if (iVar8 == 0 && iVar10 == 0) {
        invokeTest();
      }
      local_260.d.size = uVar18 | 0x4000000000000000;
      local_260.d.d = (Data *)CONCAT71(local_260.d.d._1_7_,1);
      local_48 = &local_260;
      uStack_40 = 0;
      QVar26.m_size = (size_t)"Data tag not found: %1";
      QVar26.field_0.m_data = &stack0xfffffffffffffd28;
      local_260.d.ptr = pcVar16;
      QtPrivate::argToQString(QVar26,0x4000000000000016,(ArgBase **)0x1);
      QString::toLocal8Bit_helper((QChar *)&local_2c0,local_2d0);
      if (local_2b8 == (char *)0x0) {
        local_2b8 = (char *)&QByteArray::_empty;
      }
      QTestResult::addFailure(local_2b8,(char *)0x0,0);
      if (local_2c0 != (QArrayData *)0x0) {
        LOCK();
        (local_2c0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_2c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_2c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_2c0,1,0x10);
        }
      }
      if (in_stack_fffffffffffffd28 != (QArrayData *)0x0) {
        LOCK();
        (in_stack_fffffffffffffd28->ref_)._q_value.super___atomic_base<int>._M_i =
             (in_stack_fffffffffffffd28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((in_stack_fffffffffffffd28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(in_stack_fffffffffffffd28,2,0x10);
        }
      }
    }
    QTestResult::finishedCurrentTestFunction();
    QTestResult::setSkipCurrentTest(false);
    QTestResult::setBlacklistCurrentTest(false);
    QTestTable::~QTestTable(&local_2a8);
    if (local_2a0 != (QArrayData *)0x0) {
      LOCK();
      (local_2a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_2a0,1,0x10);
      }
    }
    QBenchmarkTestMethodData::~QBenchmarkTestMethodData((QBenchmarkTestMethodData *)local_288);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return true;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    invokeTest();
    if (local_2c0 != (QArrayData *)0x0) {
      LOCK();
      (local_2c0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2c0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2c0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_2c0,1,0x10);
      }
    }
    if (in_stack_fffffffffffffd28 != (QArrayData *)0x0) {
      LOCK();
      (in_stack_fffffffffffffd28->ref_)._q_value.super___atomic_base<int>._M_i =
           (in_stack_fffffffffffffd28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((in_stack_fffffffffffffd28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(in_stack_fffffffffffffd28,2,0x10);
      }
    }
    QTestTable::~QTestTable(&local_2a8);
    if (local_2a0 != (QArrayData *)0x0) {
      LOCK();
      (local_2a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_2a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_2a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_2a0,1,0x10);
      }
    }
    QBenchmarkTestMethodData::~QBenchmarkTestMethodData((QBenchmarkTestMethodData *)local_288);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(extraout_RAX_02);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool TestMethods::invokeTest(int index, QLatin1StringView tag, std::optional<WatchDog> &watchDog) const
{
    QBenchmarkTestMethodData benchmarkData;
    QBenchmarkTestMethodData::current = &benchmarkData;

    const QByteArray &name = m_methods[index].name();
    QBenchmarkGlobalData::current->context.slotName = QLatin1StringView(name) + "()"_L1;

    char member[512];
    QTestTable table;

    QTestResult::setCurrentTestFunction(name.constData());

    const QTestTable *gTable = QTestTable::globalTestTable();
    const int globalDataCount = gTable->dataCount();
    int curGlobalDataIndex = 0;
    const auto globalDataTag = [gTable, globalDataCount](int index) {
        return globalDataCount ? gTable->testData(index)->dataTag() : nullptr;
    };

    const auto dataTagMatches = [](QLatin1StringView tag, QLatin1StringView local,
                                   QLatin1StringView global) {
        if (tag.isEmpty()) // No tag specified => run all data sets for this function
            return true;
        if (tag == local || tag == global) // Equal to either => run it
            return true;
        // Also allow global:local as a match:
        return tag.startsWith(global) && tag.endsWith(local) &&
               tag.size() == global.size() + 1 + local.size() &&
               tag[global.size()] == ':';
    };
    bool foundFunction = false;
    bool blacklisted = false;

    /* For each entry in the global data table, do: */
    do {
        if (!gTable->isEmpty())
            QTestResult::setCurrentGlobalTestData(gTable->testData(curGlobalDataIndex));

        if (curGlobalDataIndex == 0) {
            std::snprintf(member, 512, "%s_data()", name.constData());
            runWithWatchdog(watchDog, [&member] {
                invokeTestMethodIfExists(member);
            });
            if (QTestResult::skipCurrentTest())
                break;
        }

        int curDataIndex = 0;
        const int dataCount = table.dataCount();
        const auto dataTag = [&table, dataCount](int index) {
            return dataCount ? table.testData(index)->dataTag() : nullptr;
        };

        /* For each entry in this test's data table, do: */
        do {
            QTestResult::setSkipCurrentTest(false);
            QTestResult::setBlacklistCurrentTest(false);
            if (dataTagMatches(tag, QLatin1StringView(dataTag(curDataIndex)),
                               QLatin1StringView(globalDataTag(curGlobalDataIndex)))) {
                foundFunction = true;
                blacklisted = QTestPrivate::checkBlackLists(name.constData(), dataTag(curDataIndex),
                                                            globalDataTag(curGlobalDataIndex));
                if (blacklisted)
                    QTestResult::setBlacklistCurrentTest(true);

                if (blacklisted && skipBlacklisted) {
                    QTest::qSkip("Skipping blacklisted test since -skipblacklisted option is set.",
                                  NULL, 0);
                    QTestResult::finishedCurrentTestData();
                    QTestResult::finishedCurrentTestDataCleanup();
                } else {
                    QTestDataSetter s(
                        curDataIndex >= dataCount ? nullptr : table.testData(curDataIndex));

                    QTestPrivate::qtestMouseButtons = Qt::NoButton;

                    // Maintain at least 500ms mouse event timestamps between each test function
                    // call
                    QTest::lastMouseTimestamp += 500;

                    runWithWatchdog(watchDog, [this, index] {
                        invokeTestOnData(index);
                    });
                }

                if (!tag.isEmpty() && !globalDataCount)
                    break;
            }
            ++curDataIndex;
        } while (curDataIndex < dataCount);

        QTestResult::setCurrentGlobalTestData(nullptr);
        ++curGlobalDataIndex;
    } while (curGlobalDataIndex < globalDataCount);

    if (!tag.isEmpty() && !foundFunction) {
        printUnknownDataTagError(QLatin1StringView(name), tag, table, *gTable);
        QTestResult::addFailure(qPrintable("Data tag not found: %1"_L1.arg(tag)));
    }
    QTestResult::finishedCurrentTestFunction();
    QTestResult::setSkipCurrentTest(false);
    QTestResult::setBlacklistCurrentTest(false);

    return true;
}